

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u16.c
# Opt level: O1

u16 u16Shuffle(u16 w)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = (ushort)(w >> 4 ^ w) & 0xf0;
  uVar2 = (uVar2 << 4 | uVar2) ^ (uint)w;
  uVar2 = ((uVar2 >> 2 ^ uVar2) & 0xc0c) * 5 ^ uVar2;
  uVar1 = (ushort)uVar2;
  return (((ushort)(uVar2 >> 1) ^ uVar1) & 0x2222) * 3 ^ uVar1;
}

Assistant:

u16 u16Shuffle(register u16 w)
{
	register u16 t;
	t = (w ^ (w >> 4)) & 0x00F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 2)) & 0x0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 1)) & 0x2222, w ^= t ^ (t << 1);
	t = 0;
	return w;
}